

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugTextEncoding(char *str)

{
  bool bVar1;
  uint uVar2;
  ImFontGlyph *pIVar3;
  char *p;
  char *in_text;
  char *text;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint c;
  ImVec2 local_38;
  
  Text("Text: \"%s\"",str);
  local_38.x = 0.0;
  local_38.y = 0.0;
  bVar1 = BeginTable("##DebugTextEncoding",4,0x27c1,&local_38,0.0);
  if (bVar1) {
    TableSetupColumn("Offset",0,0.0,0);
    TableSetupColumn("UTF-8",0,0.0,0);
    TableSetupColumn("Glyph",0,0.0,0);
    TableSetupColumn("Codepoint",0,0.0,0);
    TableHeadersRow();
    for (in_text = str; *in_text != '\0'; in_text = in_text + (int)uVar2) {
      uVar2 = ImTextCharFromUtf8(&c,in_text,(char *)0x0);
      TableNextColumn();
      Text("%d",(ulong)(uint)((int)in_text - (int)str));
      TableNextColumn();
      uVar6 = 0;
      if (0 < (int)uVar2) {
        uVar6 = (ulong)uVar2;
      }
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        if (uVar4 != 0) {
          SameLine(0.0,-1.0);
        }
        Text("0x%02X",(ulong)(byte)in_text[uVar4]);
      }
      TableNextColumn();
      uVar5 = c;
      pIVar3 = ImFont::FindGlyphNoFallback(GImGui->Font,(ImWchar)c);
      if (pIVar3 == (ImFontGlyph *)0x0) {
        text = "[missing]";
        if (uVar5 == 0xfffd) {
          text = "[invalid]";
        }
        TextUnformatted(text,(char *)0x0);
      }
      else {
        TextUnformatted(in_text,in_text + (int)uVar2);
        uVar5 = c;
      }
      TableNextColumn();
      Text("U+%04X",(ulong)uVar5);
    }
    EndTable();
  }
  return;
}

Assistant:

void ImGui::DebugTextEncoding(const char* str)
{
    Text("Text: \"%s\"", str);
    if (!BeginTable("##DebugTextEncoding", 4, ImGuiTableFlags_Borders | ImGuiTableFlags_RowBg | ImGuiTableFlags_SizingFixedFit | ImGuiTableFlags_Resizable))
        return;
    TableSetupColumn("Offset");
    TableSetupColumn("UTF-8");
    TableSetupColumn("Glyph");
    TableSetupColumn("Codepoint");
    TableHeadersRow();
    for (const char* p = str; *p != 0; )
    {
        unsigned int c;
        const int c_utf8_len = ImTextCharFromUtf8(&c, p, NULL);
        TableNextColumn();
        Text("%d", (int)(p - str));
        TableNextColumn();
        for (int byte_index = 0; byte_index < c_utf8_len; byte_index++)
        {
            if (byte_index > 0)
                SameLine();
            Text("0x%02X", (int)(unsigned char)p[byte_index]);
        }
        TableNextColumn();
        if (GetFont()->FindGlyphNoFallback((ImWchar)c))
            TextUnformatted(p, p + c_utf8_len);
        else
            TextUnformatted((c == IM_UNICODE_CODEPOINT_INVALID) ? "[invalid]" : "[missing]");
        TableNextColumn();
        Text("U+%04X", (int)c);
        p += c_utf8_len;
    }
    EndTable();
}